

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_cache.cc
# Opt level: O1

bool __thiscall
ctemplate::TemplateCache::IsValidTemplateFilename
          (TemplateCache *this,string *filename,string *resolved_filename,FileStat *statbuf)

{
  bool bVar1;
  ostream *poVar2;
  
  bVar1 = ResolveTemplateFilename(this,filename,resolved_filename,statbuf);
  if (bVar1) {
    if (((statbuf->internal_statbuf).st_mode & 0xf000) != 0x4000) {
      return true;
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"WARNING: ",9);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,(resolved_filename->_M_dataplus)._M_p,
                        resolved_filename->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar2,"is a directory and thus not readable",0x24);
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"WARNING: ",9);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Unable to locate file ",0x16);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,(filename->_M_dataplus)._M_p,
                        filename->_M_string_length);
  }
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  return false;
}

Assistant:

bool TemplateCache::IsValidTemplateFilename(const string& filename,
                                            string* resolved_filename,
                                            FileStat* statbuf) const {
  if (!ResolveTemplateFilename(filename,
                               resolved_filename,
                               statbuf)) {
    LOG(WARNING) << "Unable to locate file " << filename << endl;
    return false;
  }
  if (statbuf->IsDirectory()) {
    LOG(WARNING) << *resolved_filename
                 << "is a directory and thus not readable" << endl;
    return false;
  }
  return true;
}